

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieparser.cpp
# Opt level: O3

void __thiscall LottieParserImpl::SkipOut(LottieParserImpl *this,int depth)

{
  bool bVar1;
  
  do {
    switch((this->super_LookaheadParserHandler).st_) {
    case kError:
      goto switchD_001333de_caseD_1;
    case kEnteringObject:
    case kEnteringArray:
      depth = depth + 1;
      break;
    case kExitingObject:
    case kExitingArray:
      depth = depth + -1;
    }
    if (((this->super_LookaheadParserHandler).r_.parseResult_.code_ != kParseErrorNone) ||
       (bVar1 = rapidjson::
                GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
                IterativeParseNext<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,LottieParserImpl>
                          ((GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>
                            *)&(this->super_LookaheadParserHandler).r_,
                           &(this->super_LookaheadParserHandler).ss_,this), !bVar1)) {
      (this->super_LookaheadParserHandler).st_ = kError;
    }
  } while (0 < depth);
switchD_001333de_caseD_1:
  return;
}

Assistant:

void LottieParserImpl::SkipOut(int depth)
{
    do {
        if (st_ == kEnteringArray || st_ == kEnteringObject) {
            ++depth;
        } else if (st_ == kExitingArray || st_ == kExitingObject) {
            --depth;
        } else if (st_ == kError) {
            return;
        }

        ParseNext();
    } while (depth > 0);
}